

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_stats.c
# Opt level: O1

void sylvan_stats_report(FILE *target)

{
  return;
}

Assistant:

void
sylvan_stats_report(FILE *target)
{
    sylvan_stats_t totals;
    sylvan_stats_snapshot(&totals);

    // fix timers for MACH
#ifdef __MACH__
    mach_timebase_info_data_t timebase;
    mach_timebase_info(&timebase);
    uint64_t c = timebase.numer/timebase.denom;
    for (int i=0;i<SYLVAN_TIMER_COUNTER;i++) totals.timers[i]*=c;
#endif

    int color = isatty(fileno(target)) ? 1 : 0;
    if (color) fprintf(target, ULINE WHITE "Sylvan statistics\n" NC);
    else fprintf(target, "Sylvan statistics\n");

    int i=0;
    for (;;) {
        if (sylvan_report_info[i].id == -1) break;
        int id = sylvan_report_info[i].id;
        int type = sylvan_report_info[i].type;
        if (type == 0) {
            if (color) fprintf(target, WHITE "\n%s\n" NC, sylvan_report_info[i].key);
            else fprintf(target, "\n%s\n", sylvan_report_info[i].key);
        } else if (type == 1) {
            if (totals.counters[id] > 0) {
                fprintf(target, "%-20s %'-16"PRIu64"\n", sylvan_report_info[i].key, totals.counters[id]);
            }
        } else if (type == 2) {
            if (totals.counters[id] > 0) {
                fprintf(target, "%-20s %'-16"PRIu64 " %'-16"PRIu64" %'-16"PRIu64 "\n", sylvan_report_info[i].key, totals.counters[id], totals.counters[id+1], totals.counters[id+2]);
            }
        } else if (type == 3) {
            if (totals.timers[id] > 0) {
                fprintf(target, "%-20s %'.6Lf sec.\n", sylvan_report_info[i].key, (long double)totals.timers[id]/1000000000);
            }
        } else if (type == 4) {
            fprintf(target, "%-20s %'zu of %'zu buckets filled.\n", "Unique nodes table", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            fprintf(target, "%-20s %'zu of %'zu buckets filled.\n", "Operation cache", cache_getused(), cache_getsize());
            char buf[64], buf2[64];
            to_h(24ULL * llmsset_get_size(nodes), buf);
            to_h(24ULL * llmsset_get_max_size(nodes), buf2);
            fprintf(target, "%-20s %s (max real) of %s (allocated virtual memory).\n", "Memory (nodes)", buf, buf2);
            to_h(36ULL * cache_getsize(), buf);
            to_h(36ULL * cache_getmaxsize(), buf2);
            fprintf(target, "%-20s %s (max real) of %s (allocated virtual memory).\n", "Memory (cache)", buf, buf2);
        }
        i++;
    }
}